

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ldebug.c
# Opt level: O1

int lua_getinfo(lua_State *L,char *what,lua_Debug *ar)

{
  byte bVar1;
  long lVar2;
  long lVar3;
  StkId pSVar4;
  Proto *pPVar5;
  uint uVar6;
  int iVar7;
  int iVar8;
  Table *t;
  StkId pSVar9;
  char *pcVar10;
  byte *pbVar11;
  CallInfo *pCVar12;
  ulong uVar13;
  long lVar14;
  Table *x_;
  int local_64;
  TValue local_40;
  
  if (*what == '>') {
    pSVar9 = (StkId)((L->top).offset + -0x10);
    what = what + 1;
    (L->top).p = pSVar9;
    pCVar12 = (CallInfo *)0x0;
  }
  else {
    pCVar12 = ar->i_ci;
    pSVar9 = (pCVar12->func).p;
  }
  if (((pSVar9->val).tt_ | 0x20) == 0x66) {
    lVar14 = *(long *)pSVar9;
  }
  else {
    lVar14 = 0;
  }
  local_64 = 1;
  pbVar11 = (byte *)what;
  do {
    bVar1 = *pbVar11;
    if (bVar1 < 0x66) {
      if (bVar1 != 0x4c) {
        if (bVar1 != 0x53) {
          if (bVar1 == 0) {
            pcVar10 = strchr(what,0x66);
            if (pcVar10 != (char *)0x0) {
              pSVar4 = (L->top).p;
              *(Value *)pSVar4 = (pSVar9->val).value_;
              (pSVar4->val).tt_ = (pSVar9->val).tt_;
              (L->top).p = (StkId)((L->top).offset + 0x10);
            }
            pcVar10 = strchr(what,0x4c);
            if (pcVar10 != (char *)0x0) {
              if ((lVar14 == 0) || (*(char *)(lVar14 + 8) != '\x06')) {
                *(undefined1 *)((L->top).offset + 8) = 0;
                (L->top).p = (StkId)((L->top).offset + 0x10);
              }
              else {
                pPVar5 = *(Proto **)(lVar14 + 0x18);
                iVar8 = pPVar5->linedefined;
                t = luaH_new(L);
                pSVar9 = (L->top).p;
                *(Table **)pSVar9 = t;
                (pSVar9->val).tt_ = 'E';
                (L->top).p = (StkId)((L->top).offset + 0x10);
                if (pPVar5->lineinfo != (char *)0x0) {
                  local_40.tt_ = '\x11';
                  uVar6 = 0;
                  if ((pPVar5->flag & 1) != 0) {
                    iVar7 = (int)*pPVar5->lineinfo;
                    if (iVar7 == -0x80) {
                      iVar8 = luaG_getfuncline(pPVar5,0);
                    }
                    else {
                      iVar8 = iVar8 + iVar7;
                    }
                    uVar6 = 1;
                  }
                  if ((int)uVar6 < pPVar5->sizelineinfo) {
                    uVar13 = (ulong)uVar6;
                    do {
                      if (pPVar5->lineinfo[uVar13] == -0x80) {
                        iVar8 = luaG_getfuncline(pPVar5,(int)uVar13);
                      }
                      else {
                        iVar8 = iVar8 + pPVar5->lineinfo[uVar13];
                      }
                      luaH_setint(L,t,(long)iVar8,&local_40);
                      uVar13 = uVar13 + 1;
                    } while ((int)uVar13 < pPVar5->sizelineinfo);
                  }
                }
              }
            }
            return local_64;
          }
          goto switchD_0010a231_caseD_6d;
        }
        if ((lVar14 == 0) || (*(char *)(lVar14 + 8) != '\x06')) {
          ar->source = "=[C]";
          ar->srclen = 4;
          ar->linedefined = -1;
          ar->lastlinedefined = -1;
          pcVar10 = "C";
        }
        else {
          lVar2 = *(long *)(lVar14 + 0x18);
          lVar3 = *(long *)(lVar2 + 0x70);
          if (lVar3 == 0) {
            ar->source = "=?";
            ar->srclen = 2;
          }
          else {
            if ((long)*(char *)(lVar3 + 0xb) < 0) {
              ar->srclen = *(size_t *)(lVar3 + 0x10);
              pcVar10 = *(char **)(lVar3 + 0x18);
            }
            else {
              ar->srclen = (long)*(char *)(lVar3 + 0xb);
              pcVar10 = (char *)(lVar3 + 0x18);
            }
            ar->source = pcVar10;
          }
          iVar8 = *(int *)(lVar2 + 0x2c);
          ar->linedefined = iVar8;
          ar->lastlinedefined = *(int *)(lVar2 + 0x30);
          pcVar10 = "Lua";
          if (iVar8 == 0) {
            pcVar10 = "main";
          }
        }
        ar->what = pcVar10;
        luaO_chunkid(ar->short_src,ar->source,ar->srclen);
      }
    }
    else {
      switch(bVar1) {
      case 0x6c:
        iVar8 = -1;
        if ((pCVar12 != (CallInfo *)0x0) && ((pCVar12->callstatus & 0x8000) == 0)) {
          pPVar5 = *(Proto **)((((pCVar12->func).p)->val).value_.f + 0x18);
          iVar8 = luaG_getfuncline(pPVar5,(int)((ulong)((long)(pCVar12->u).l.savedpc -
                                                       (long)pPVar5->code) >> 2) + -1);
        }
        ar->currentline = iVar8;
        break;
      case 0x6d:
      case 0x6f:
      case 0x70:
      case 0x71:
      case 0x73:
switchD_0010a231_caseD_6d:
        local_64 = 0;
        break;
      case 0x6e:
        if ((pCVar12 == (CallInfo *)0x0) || ((pCVar12->callstatus & 0x400000) != 0)) {
          pcVar10 = (char *)0x0;
        }
        else {
          pcVar10 = funcnamefromcall(L,pCVar12->previous,&ar->name);
        }
        ar->namewhat = pcVar10;
        if (pcVar10 == (char *)0x0) {
          ar->namewhat = "";
          ar->name = (char *)0x0;
        }
        break;
      case 0x72:
        if ((pCVar12 == (CallInfo *)0x0) || ((pCVar12->callstatus & 0x100000) == 0)) {
          ar->ftransfer = 0;
          ar->ntransfer = 0;
        }
        else {
          ar->ftransfer = (L->transferinfo).ftransfer;
          ar->ntransfer = (L->transferinfo).ntransfer;
        }
        break;
      case 0x74:
        if (pCVar12 == (CallInfo *)0x0) {
          ar->extraargs = '\0';
          ar->istailcall = '\0';
        }
        else {
          uVar6 = pCVar12->callstatus;
          ar->istailcall = (byte)(uVar6 >> 0x16) & 1;
          ar->extraargs = (byte)(uVar6 >> 8) & 0xf;
        }
        break;
      case 0x75:
        if (lVar14 == 0) {
          ar->nups = '\0';
        }
        else {
          ar->nups = *(uchar *)(lVar14 + 10);
          if (*(char *)(lVar14 + 8) == '\x06') {
            ar->isvararg = *(byte *)(*(long *)(lVar14 + 0x18) + 0xb) & 1;
            ar->nparams = *(uchar *)(*(long *)(lVar14 + 0x18) + 10);
            break;
          }
        }
        ar->nparams = '\0';
        ar->isvararg = '\x01';
        break;
      default:
        if (bVar1 != 0x66) goto switchD_0010a231_caseD_6d;
      }
    }
    pbVar11 = pbVar11 + 1;
  } while( true );
}

Assistant:

LUA_API int lua_getinfo (lua_State *L, const char *what, lua_Debug *ar) {
  int status;
  Closure *cl;
  CallInfo *ci;
  TValue *func;
  lua_lock(L);
  if (*what == '>') {
    ci = NULL;
    func = s2v(L->top.p - 1);
    api_check(L, ttisfunction(func), "function expected");
    what++;  /* skip the '>' */
    L->top.p--;  /* pop function */
  }
  else {
    ci = ar->i_ci;
    func = s2v(ci->func.p);
    lua_assert(ttisfunction(func));
  }
  cl = ttisclosure(func) ? clvalue(func) : NULL;
  status = auxgetinfo(L, what, ar, cl, ci);
  if (strchr(what, 'f')) {
    setobj2s(L, L->top.p, func);
    api_incr_top(L);
  }
  if (strchr(what, 'L'))
    collectvalidlines(L, cl);
  lua_unlock(L);
  return status;
}